

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

uint32 Bstrlib::getUnicode(uchar **array)

{
  byte bVar1;
  uint uVar2;
  uint32 uVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  
  pbVar4 = *array;
  bVar1 = *pbVar4;
  uVar2 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) != 0) {
      uVar2 = 0x7f;
      uVar6 = 0x40;
      iVar5 = 1;
      do {
        uVar2 = uVar2 >> 1;
        uVar6 = uVar6 >> 1;
        iVar5 = iVar5 + 1;
      } while ((uVar6 & bVar1) != 0);
      uVar3 = bVar1 & uVar2;
      *array = pbVar4 + 1;
      pbVar4 = pbVar4 + 2;
      while( true ) {
        bVar1 = pbVar4[-1];
        if (bVar1 == 0) {
          return uVar3;
        }
        if ((bVar1 & 0xffffffc0) != 0x80) break;
        uVar3 = uVar3 << 6 | bVar1 & 0x3f;
        *array = pbVar4;
        iVar5 = iVar5 + -1;
        pbVar4 = pbVar4 + 1;
        if (iVar5 < 2) {
          return uVar3;
        }
      }
      return uVar3;
    }
    uVar2 = bVar1 & 0x3f;
  }
  else if (bVar1 == 0) {
    return 0;
  }
  *array = pbVar4 + 1;
  return uVar2;
}

Assistant:

uint32 getUnicode(const unsigned char * & array)
    {
        // Get the current char
        const uint8 c = *array;
        if ((c & 0x80))
        {
            // The data is in the 7 low bits
            uint32 dataMask = 0x7f;
            // The count bit mask
            uint32 bitCountMask = 0x40;
            // The consumption count
            int charCount = 0;

            while ((c & bitCountMask) != 0 && bitCountMask)
            {
                ++charCount;
                dataMask >>= 1; bitCountMask >>= 1;
            }

            // Get the few bits remaining here
            uint32 n = (c & dataMask);

            // Then extract the remaining bits
            ++array;
            while (--charCount >= 0 && *array)
            {
                const uint8 extra = *array;
                // Make sure it's a valid UTF8 encoding
                if ((extra & 0xc0) != 0x80) break;

                // Store the new bits too
                n <<= 6; n |= (extra & 0x3f);
                ++array;
            }
            return n;
        }
        if (c) ++array;
        return c;
    }